

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O3

Var __thiscall
Js::HelperMethodWrapper<Js::HelperMethodWrapper1(Js::ScriptContext*,void*,void*)::__0>
          (Js *this,ScriptContext *scriptContext,anon_class_16_2_a2bd5e14 fn)

{
  bool bVar1;
  DebuggingFlags *this_00;
  Var pvVar2;
  AutoRegisterIgnoreExceptionWrapper local_28;
  AutoRegisterIgnoreExceptionWrapper autoWrapper;
  
  this_00 = DebugManager::GetDebuggingFlags(*(DebugManager **)(*(long *)(this + 0x3b8) + 0xa0));
  bVar1 = DebuggingFlags::IsBuiltInWrapperPresent(this_00);
  if (bVar1) {
    pvVar2 = (Var)(*(code *)scriptContext)(fn.origHelperAddr);
    return pvVar2;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_28,*(ThreadContext **)(this + 0x3b8));
  pvVar2 = (Var)(*(code *)scriptContext)(fn.origHelperAddr);
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_28);
  return pvVar2;
}

Assistant:

Var HelperMethodWrapper(ScriptContext* scriptContext, Fn fn)
    {
        if (AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext()))
        {
            return fn();
        }
        else
        {
            AutoRegisterIgnoreExceptionWrapper autoWrapper(scriptContext->GetThreadContext());
            return HelperOrLibraryMethodWrapper<false>(scriptContext, fn);
        }
    }